

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O2

string * spvLogStringForEnv_abi_cxx11_(string *__return_storage_ptr__,spv_target_env_conflict env)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(env) {
  case EBadProfile:
  case ECoreProfile:
  case SPV_ENV_UNIVERSAL_1_2:
  case SPV_ENV_UNIVERSAL_1_3:
  case SPV_ENV_UNIVERSAL_1_4:
  case SPV_ENV_UNIVERSAL_1_5:
  case SPV_ENV_UNIVERSAL_1_6:
    __s = "Universal";
    __a = &local_c;
    break;
  case ENoProfile:
  case SPV_ENV_VULKAN_1_1:
  case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
  case SPV_ENV_VULKAN_1_2:
  case SPV_ENV_VULKAN_1_3:
  case SPV_ENV_VULKAN_1_4:
    __s = "Vulkan";
    __a = &local_b;
    break;
  case PTHREAD_MUTEX_ADAPTIVE_NP:
  case ECompatibilityProfile:
  case SPV_ENV_OPENCL_1_2:
  case SPV_ENV_OPENCL_EMBEDDED_1_2:
  case SPV_ENV_OPENCL_2_0:
  case CODESET:
  case SPV_ENV_OPENCL_EMBEDDED_2_1:
  case EShReflectionAllBlockVariables:
    __s = "OpenCL";
    __a = &local_9;
    break;
  case SPV_ENV_OPENGL_4_0:
  case NonSemanticClspvReflectionRevision:
  case SPV_ENV_OPENGL_4_2:
  case EEsProfile:
  case EProfileCount:
    __s = "OpenGL";
    __a = &local_a;
    break;
  case SPV_ENV_WEBGPU_0:
    __assert_fail("false && \"Deprecated target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x1dd,"std::string spvLogStringForEnv(spv_target_env)");
  case SPV_ENV_MAX:
    __assert_fail("false && \"Invalid target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x1e0,"std::string spvLogStringForEnv(spv_target_env)");
  default:
    __s = "Unknown";
    __a = &local_d;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string spvLogStringForEnv(spv_target_env env) {
  switch (env) {
    case SPV_ENV_OPENCL_1_2:
    case SPV_ENV_OPENCL_2_0:
    case SPV_ENV_OPENCL_2_1:
    case SPV_ENV_OPENCL_2_2:
    case SPV_ENV_OPENCL_EMBEDDED_1_2:
    case SPV_ENV_OPENCL_EMBEDDED_2_0:
    case SPV_ENV_OPENCL_EMBEDDED_2_1:
    case SPV_ENV_OPENCL_EMBEDDED_2_2: {
      return "OpenCL";
    }
    case SPV_ENV_OPENGL_4_0:
    case SPV_ENV_OPENGL_4_1:
    case SPV_ENV_OPENGL_4_2:
    case SPV_ENV_OPENGL_4_3:
    case SPV_ENV_OPENGL_4_5: {
      return "OpenGL";
    }
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_VULKAN_1_1:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    case SPV_ENV_VULKAN_1_2:
    case SPV_ENV_VULKAN_1_3:
    case SPV_ENV_VULKAN_1_4: {
      return "Vulkan";
    }
    case SPV_ENV_UNIVERSAL_1_0:
    case SPV_ENV_UNIVERSAL_1_1:
    case SPV_ENV_UNIVERSAL_1_2:
    case SPV_ENV_UNIVERSAL_1_3:
    case SPV_ENV_UNIVERSAL_1_4:
    case SPV_ENV_UNIVERSAL_1_5:
    case SPV_ENV_UNIVERSAL_1_6: {
      return "Universal";
    }
    case SPV_ENV_WEBGPU_0:
      assert(false && "Deprecated target environment value.");
      break;
    case SPV_ENV_MAX:
      assert(false && "Invalid target environment value.");
      break;
  }
  return "Unknown";
}